

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation.cpp
# Opt level: O0

void __thiscall QVariantAnimationPrivate::updateInterpolator(QVariantAnimationPrivate *this)

{
  int iVar1;
  int iVar2;
  Interpolator p_Var3;
  long in_RDI;
  int type;
  int in_stack_0000001c;
  
  iVar1 = ::QVariant::userType((QVariant *)0x68d846);
  iVar2 = ::QVariant::userType((QVariant *)0x68d86a);
  if (iVar1 == iVar2) {
    p_Var3 = getInterpolator(in_stack_0000001c);
    *(Interpolator *)(in_RDI + 0x158) = p_Var3;
  }
  else {
    *(undefined8 *)(in_RDI + 0x158) = 0;
  }
  if (*(long *)(in_RDI + 0x158) == 0) {
    *(code **)(in_RDI + 0x158) = defaultInterpolator;
  }
  return;
}

Assistant:

void QVariantAnimationPrivate::updateInterpolator()
{
    int type = currentInterval.start.second.userType();
    if (type == currentInterval.end.second.userType())
        interpolator = getInterpolator(type);
    else
        interpolator = nullptr;

    //we make sure that the interpolator is always set to something
    if (!interpolator)
        interpolator = &defaultInterpolator;
}